

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O1

string * __thiscall
multi_agent_planning::Interaction::toString_abi_cxx11_
          (string *__return_storage_ptr__,Interaction *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_190,this->agentA);
  pbVar1 = std::operator<<(pbVar1,&this->actionA);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar1," -> ",4);
  pbVar1 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<((ostream *)pbVar1,this->agentB);
  pbVar1 = std::operator<<(pbVar1,&this->actionB);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar1,": ",2);
  std::ostream::operator<<((ostream *)pbVar1,this->cost);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string Interaction::toString() const {
	stringstream ss;
	ss << agentA << actionA << " -> " << agentB << actionB << ": " << cost;
	return ss.str();
}